

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

SetupSendResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::setupSend
          (SetupSendResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  uint *puVar1;
  RpcConnectionState *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar4;
  OutgoingRpcMessage *pOVar5;
  uint *puVar6;
  size_t sVar7;
  ArrayDisposer *pAVar8;
  Builder payload;
  SourceLocation location;
  int *piVar9;
  RemoveConst<int> *pRVar10;
  int *piVar11;
  Disposer *node;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar12;
  long lVar13;
  Question *pQVar14;
  QuestionRef *pQVar15;
  WirePointer *pWVar16;
  QuestionRef *pQVar17;
  Refcounted *refcounted;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  Vector<int> fds;
  SendInternalResult result;
  QuestionId questionId;
  Array<unsigned_int> exports;
  Vector<int> local_128;
  QuestionRef *local_108;
  QuestionRef *pQVar18;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  Array<unsigned_int> local_d8;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> local_b8;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPStack_a8;
  WirePointer *local_a0;
  int *local_98;
  long lStack_90;
  ArrayDisposer *local_88;
  char *local_78;
  char *pcStack_70;
  undefined8 local_68;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_60;
  StructBuilder local_58;
  
  local_128.builder.ptr = (int *)0x0;
  local_128.builder.pos = (RemoveConst<int> *)0x0;
  local_128.builder.endPtr = (RemoveConst<int> *)0x0;
  local_128.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  pRVar2 = (this->connectionState).ptr;
  pMVar3 = (this->capTable).table.builder.ptr;
  pRVar4 = (this->capTable).table.builder.pos;
  local_108 = (QuestionRef *)(this->callBuilder)._builder.segment;
  PointerBuilder::getStruct(&local_58,(PointerBuilder *)&local_108,(StructSize)0x20000,(word *)0x0);
  local_60.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  payload._builder.capTable = local_58.capTable;
  payload._builder.segment = local_58.segment;
  payload._builder.data = local_58.data;
  payload._builder.pointers = local_58.pointers;
  payload._builder.dataSize = local_58.dataSize;
  payload._builder.pointerCount = local_58.pointerCount;
  payload._builder._38_2_ = local_58._38_2_;
  capTable.size_ = (long)pRVar4 - (long)pMVar3 >> 4;
  capTable.ptr = pMVar3;
  writeDescriptors(&local_d8,pRVar2,capTable,payload,&local_128,&local_60);
  pOVar5 = (this->message).ptr;
  if (local_128.builder.pos != local_128.builder.endPtr) {
    kj::Vector<int>::setCapacity
              (&local_128,(long)local_128.builder.pos - (long)local_128.builder.ptr >> 2);
  }
  lStack_90 = (long)local_128.builder.pos - (long)local_128.builder.ptr >> 2;
  local_98 = local_128.builder.ptr;
  local_88 = local_128.builder.disposer;
  local_128.builder.ptr = (int *)0x0;
  local_128.builder.pos = (RemoveConst<int> *)0x0;
  local_128.builder.endPtr = (int *)0x0;
  (*pOVar5->_vptr_OutgoingRpcMessage[1])(pOVar5,&local_98);
  lVar13 = lStack_90;
  piVar9 = local_98;
  if (local_98 != (int *)0x0) {
    local_98 = (int *)0x0;
    lStack_90 = 0;
    (**local_88->_vptr_ArrayDisposer)(local_88,piVar9,4,lVar13,lVar13,0);
  }
  pQVar14 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                      (&((this->connectionState).ptr)->questions,(uint *)&stack0xffffffffffffff14);
  pQVar14->isAwaitingReturn = true;
  puVar6 = (pQVar14->paramExports).ptr;
  if (puVar6 != (uint *)0x0) {
    sVar7 = (pQVar14->paramExports).size_;
    pAVar8 = (pQVar14->paramExports).disposer;
    (pQVar14->paramExports).ptr = (uint *)0x0;
    (pQVar14->paramExports).size_ = 0;
    (**pAVar8->_vptr_ArrayDisposer)(pAVar8,puVar6,4,sVar7,sVar7,0);
  }
  (pQVar14->paramExports).ptr = local_d8.ptr;
  (pQVar14->paramExports).size_ = local_d8.size_;
  (pQVar14->paramExports).disposer = local_d8.disposer;
  local_d8.ptr = (uint *)0x0;
  local_d8.size_ = 0;
  pQVar14->isTailCall = isTailCall;
  local_108 = (QuestionRef *)0x0;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++";
  pcStack_70 = "setupSend";
  local_68 = 0x1200000a10;
  location.lineNumber = in_stack_ffffffffffffff10;
  location.fileName = (char *)0x0;
  location.function = (char *)0x0;
  location.columnNumber = in_stack_ffffffffffffff14;
  kj::
  newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
            (location);
  pRVar2 = (this->connectionState).ptr;
  pQVar15 = (QuestionRef *)operator_new(0x38);
  pPVar12 = pPStack_a8;
  (pQVar15->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006ce258;
  puVar1 = &(pRVar2->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (pQVar15->connectionState).ptr.disposer = &(pRVar2->super_Refcounted).super_Disposer;
  (pQVar15->connectionState).ptr.ptr = pRVar2;
  pQVar15->id = in_stack_ffffffffffffff14;
  pPStack_a8 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                *)0x0;
  (pQVar15->fulfiller).ptr.disposer = (Disposer *)local_b8.ptr;
  (pQVar15->fulfiller).ptr.ptr = pPVar12;
  (pQVar14->selfRef).ptr = pQVar15;
  (pQVar15->super_Refcounted).refcount = 2;
  local_108 = pQVar15;
  pQVar18 = pQVar15;
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>::
  attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
            ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
              *)&local_a0,&local_b8);
  pWVar16 = local_a0;
  local_a0 = (WirePointer *)0x0;
  pQVar17 = pQVar15;
  if (pQVar15 != (QuestionRef *)0x0) {
    (**(pQVar15->super_Refcounted).super_Disposer._vptr_Disposer)
              (pQVar15,(pQVar15->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                       (long)&(pQVar15->super_Refcounted).super_Disposer._vptr_Disposer);
    pQVar15 = pQVar18;
    pQVar17 = local_108;
  }
  pPVar12 = pPStack_a8;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.disposer = (Disposer *)pQVar17;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.ptr = pQVar15;
  (__return_storage_ptr__->super_SendInternalResult).promise.super_PromiseBase.node.ptr =
       (PromiseNode *)pWVar16;
  __return_storage_ptr__->questionId = in_stack_ffffffffffffff14;
  __return_storage_ptr__->question = pQVar14;
  if (pPStack_a8 !=
      (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
       *)0x0) {
    pPStack_a8 = (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                  *)0x0;
    (**((local_b8.ptr)->super_Refcounted).super_Disposer._vptr_Disposer)
              (local_b8.ptr,(long)pPVar12 + *(long *)(*(long *)pPVar12 + -0x10));
  }
  node = local_b8.disposer;
  if ((PromiseArenaMember *)local_b8.disposer != (PromiseArenaMember *)0x0) {
    local_b8.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  sVar7 = local_d8.size_;
  puVar6 = local_d8.ptr;
  if (local_d8.ptr != (uint *)0x0) {
    local_d8.ptr = (uint *)0x0;
    local_d8.size_ = 0;
    (**(local_d8.disposer)->_vptr_ArrayDisposer)(local_d8.disposer,puVar6,4,sVar7,sVar7,0);
  }
  piVar11 = local_128.builder.endPtr;
  pRVar10 = local_128.builder.pos;
  piVar9 = local_128.builder.ptr;
  if (local_128.builder.ptr != (int *)0x0) {
    local_128.builder.ptr = (int *)0x0;
    local_128.builder.pos = (RemoveConst<int> *)0x0;
    local_128.builder.endPtr = (int *)0x0;
    (**(local_128.builder.disposer)->_vptr_ArrayDisposer)
              (local_128.builder.disposer,piVar9,4,(long)pRVar10 - (long)piVar9 >> 2,
               (long)piVar11 - (long)piVar9 >> 2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

SetupSendResult setupSend(bool isTailCall) {
      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.next(questionId);
      question.isAwaitingReturn = true;
      question.paramExports = kj::mv(exports);
      question.isTailCall = isTailCall;

      // Make the QuestionRef and result promise.
      SendInternalResult result;
      auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();
      result.questionRef = kj::refcounted<QuestionRef>(
          *connectionState, questionId, kj::mv(paf.fulfiller));
      question.selfRef = *result.questionRef;
      result.promise = paf.promise.attach(kj::addRef(*result.questionRef));

      return { kj::mv(result), questionId, question };
    }